

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_interface,_interface,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *this;
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::deduced,_boost::ext::di::v1_3_0::core::deduced,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *this_00;
  anon_class_8_1_e9a4e06a *this_01;
  i *injector_00;
  example local_58;
  example local_54;
  example object_1;
  example object;
  undefined8 local_3c;
  undefined1 local_30 [8];
  i injector;
  anon_class_8_1_e9a4e06a module;
  bool runtime_value;
  
  module.runtime_value._4_4_ = 0;
  module.runtime_value._3_1_ = 0;
  injector.super_injector_t._16_8_ = (long)&module.runtime_value + 3;
  this = boost::ext::di::v1_3_0::core::
         dependency<boost::ext::di::v1_3_0::scopes::deduce,_interface,_interface,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
         ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_interface,_interface,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                       *)&boost::ext::di::v1_3_0::bind<interface>);
  boost::ext::di::v1_3_0::core::
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_interface,_interface,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  ::to<implementation,_0,_0>(this);
  this_00 = boost::ext::di::v1_3_0::core::
            dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::deduced,_boost::ext::di::v1_3_0::core::deduced,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
            ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::deduced,_boost::ext::di::v1_3_0::core::deduced,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                          *)&boost::ext::di::v1_3_0::bind<>);
  local_3c._0_4_ = 0x2a;
  this_01 = (anon_class_8_1_e9a4e06a *)&local_3c;
  local_3c._4_4_ =
       (int)boost::ext::di::v1_3_0::core::
            dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::deduced,_boost::ext::di::v1_3_0::core::deduced,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
            ::to<int,_0,_0>(this_00,(int *)this_01);
  _object_1 = main::anon_class_8_1_e9a4e06a::operator()
                        ((i *)&injector.super_injector_t.field_0x10,this_01);
  injector_00 = (i *)(ulong)(uint)local_3c._4_4_;
  boost::ext::di::v1_3_0::
  make_injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_interface,_implementation,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_i,_0,_0>
            (local_30,injector_00,_object_1);
  local_54 = boost::ext::di::v1_3_0::core::
             injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_interface,_implementation,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_i>
             ::create<example,_0>
                       ((injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_interface,_implementation,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_i>
                         *)local_30);
  bVar1 = example::run(&local_54);
  if (!bVar1) {
    __assert_fail("object.run()",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/example.cpp"
                  ,0x9b,"int main()");
  }
  local_58 = boost::ext::di::v1_3_0::operator()((v1_3_0 *)local_30,injector_00);
  bVar1 = example::run(&local_58);
  if (!bVar1) {
    __assert_fail("object.run()",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/example.cpp"
                  ,0xa1,"int main()");
  }
  return module.runtime_value._4_4_;
}

Assistant:

int main() {
  auto runtime_value = false;

  // clang-format off
  auto module = [&] {
    return di::make_injector(
      di::bind<>().to(runtime_value)
    );
  };

  auto injector = di::make_injector(
    di::bind<interface>().to<implementation>()
  , di::bind<>().to(42)
  , module()
  );
  // clang-format on

  /*<<create `example` - member function call>>*/
  {
    auto object = injector.create<example>();
    assert(object.run());
  }

  /*<<create `example` - free function call>>*/
  {
    auto object = di::create<example>(injector);
    assert(object.run());
  }
}